

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
poly::
vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
::tidy(vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
       *this)

{
  elem_ptr_pointer pvVar1;
  size_type sVar2;
  my_base *this_00;
  vector_elem_ptr<poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>_>_>
  *local_18;
  elem_ptr_pointer i;
  vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
  *this_local;
  
  clear(this);
  local_18 = begin_elem(this);
  while( true ) {
    pvVar1 = begin_elem(this);
    sVar2 = capacity(this);
    if (local_18 == pvVar1 + sVar2) break;
    this_00 = base(this);
    vector_impl::
    allocator_base<custom::Allocator<unsigned_char,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>>>>
    ::
    destroy<poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>>>,std::integral_constant<bool,true>>,std::allocator_traits<custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>>>>>*>
              ((allocator_base<custom::Allocator<unsigned_char,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>>>>
                *)this_00,local_18);
    local_18 = local_18 + 1;
  }
  this->_free_elem = (elem_ptr_pointer)0x0;
  this->_begin_storage = (void_pointer)0x0;
  vector_impl::
  allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>_>
  ::tidy(&this->
          super_allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>_>
        );
  return;
}

Assistant:

inline void vector<I, A, C>::tidy() noexcept
{
    clear();
    for (auto i = begin_elem(); i != begin_elem() + capacity(); ++i) {
        base().destroy(i);
    }
    _begin_storage = _free_elem = nullptr;
    my_base::tidy();
}